

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_eval.h
# Opt level: O3

double mp::ComputeValue<mp::VarInfoRecomp>(NumberofVarConstraint *con,VarInfoRecomp *x)

{
  VarVecRecomp *this;
  int i;
  long lVar1;
  double dVar2;
  double dVar3;
  double local_38;
  
  this = &(x->super_VarInfoRecompTypedef).x_;
  dVar2 = VarVecRecomp::operator[]
                    (this,*(con->
                           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumberofVarId>
                           ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start);
  lVar1 = ((long)(con->
                 super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumberofVarId>
                 ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(con->
                 super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumberofVarId>
                 ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2) + -1;
  if (lVar1 == 0) {
    local_38 = 0.0;
  }
  else {
    local_38 = 0.0;
    do {
      i = (con->
          super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumberofVarId>
          ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar1];
      if ((x->super_VarInfoRecompTypedef).type_.data_[i] == INTEGER) {
        dVar3 = VarVecRecomp::operator[](this,i);
        dVar3 = round(dVar3);
        if ((dVar3 != dVar2) || (NAN(dVar3) || NAN(dVar2))) goto LAB_002115ca;
LAB_002115ed:
        local_38 = local_38 + 1.0;
      }
      else {
LAB_002115ca:
        dVar3 = VarVecRecomp::operator[](this,i);
        if (ABS(dVar3 - dVar2) <= (x->super_VarInfoRecompTypedef).feastol_) goto LAB_002115ed;
      }
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return local_38;
}

Assistant:

double ComputeValue(const NumberofVarConstraint& con, const VarVec& x) {
  double result = 0.0;
  const auto& args = con.GetArguments();
  auto k = x[args[0]];
  for (auto i=args.size(); --i; ) {
    auto v = args[i];
    if ((x.is_var_int(v)
         && std::round(x[v]) == k)
        || std::fabs(x[v] - k) <= x.feastol())
      ++result;
  }
  return result;
}